

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_neon_negl(TCGContext_conflict1 *tcg_ctx,TCGv_i64 var,int size)

{
  code *func;
  TCGTemp *args [1];
  
  if (size != 2) {
    args[0] = (TCGTemp *)(var + (long)tcg_ctx);
    if (size == 1) {
      func = helper_neon_negl_u32_aarch64;
    }
    else {
      func = helper_neon_negl_u16_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,func,args[0],1,args);
    return;
  }
  tcg_gen_neg_i64(tcg_ctx,var,var);
  return;
}

Assistant:

static inline void gen_neon_negl(TCGContext *tcg_ctx, TCGv_i64 var, int size)
{
    switch (size) {
    case 0: gen_helper_neon_negl_u16(tcg_ctx, var, var); break;
    case 1: gen_helper_neon_negl_u32(tcg_ctx, var, var); break;
    case 2:
        tcg_gen_neg_i64(tcg_ctx, var, var);
        break;
    default: abort();
    }
}